

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

char * auth_digest_string_quoted(char *source)

{
  size_t sVar1;
  char *pcVar2;
  size_t local_30;
  size_t n;
  char *s;
  char *d;
  char *dest;
  char *source_local;
  
  local_30 = 1;
  for (n = (size_t)source; *(char *)n != '\0'; n = n + 1) {
    if ((*(char *)n == '\"') || (sVar1 = local_30 + 1, *(char *)n == '\\')) {
      sVar1 = local_30 + 2;
    }
    local_30 = sVar1;
  }
  pcVar2 = (char *)(*Curl_cmalloc)(local_30);
  n = (size_t)source;
  s = pcVar2;
  if (pcVar2 != (char *)0x0) {
    while (*(char *)n != '\0') {
      if ((*(char *)n == '\"') || (*(char *)n == '\\')) {
        *s = '\\';
        s = s + 1;
      }
      *s = *(char *)n;
      n = n + 1;
      s = s + 1;
    }
    *s = '\0';
  }
  return pcVar2;
}

Assistant:

static char *auth_digest_string_quoted(const char *source)
{
  char *dest, *d;
  const char *s = source;
  size_t n = 1; /* null terminator */

  /* Calculate size needed */
  while(*s) {
    ++n;
    if(*s == '"' || *s == '\\') {
      ++n;
    }
    ++s;
  }

  dest = malloc(n);
  if(dest) {
    s = source;
    d = dest;
    while(*s) {
      if(*s == '"' || *s == '\\') {
        *d++ = '\\';
      }
      *d++ = *s++;
    }
    *d = 0;
  }

  return dest;
}